

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionShape * __thiscall
btCollisionWorldImporter::createPlaneShape
          (btCollisionWorldImporter *this,btVector3 *planeNormal,btScalar planeConstant)

{
  btCollisionShape *_Val;
  btScalar unaff_retaddr;
  btVector3 *in_stack_00000008;
  btStaticPlaneShape *in_stack_00000010;
  btStaticPlaneShape *shape;
  btAlignedObjectArray<btCollisionShape_*> *in_stack_ffffffffffffffd0;
  
  _Val = (btCollisionShape *)btStaticPlaneShape::operator_new(0x187487);
  btStaticPlaneShape::btStaticPlaneShape(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  btAlignedObjectArray<btCollisionShape_*>::push_back
            (in_stack_ffffffffffffffd0,(btCollisionShape **)_Val);
  return _Val;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createPlaneShape(const btVector3& planeNormal,btScalar planeConstant)
{
	btStaticPlaneShape* shape = new btStaticPlaneShape(planeNormal,planeConstant);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}